

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocArrayofArrays::~UniformLocArrayofArrays
          (UniformLocArrayofArrays *this)

{
  UniformLocArrayofArrays *this_local;
  
  ~UniformLocArrayofArrays(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform float[2][3]  u0;
		//layout (location = 8) uniform vec3[2][2]   u1;
		//layout (location = 12) uniform float       u2;
		std::vector<Uniform> uniforms;
		{
			std::vector<int> arraySizesSegmented(2);
			arraySizesSegmented[0] = 2;
			arraySizesSegmented[1] = 3;
			uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, arraySizesSegmented), Loc::C(2)));
		}
		{
			std::vector<int> arraySizesSegmented(2);
			arraySizesSegmented[0] = arraySizesSegmented[1] = 2;
			uniforms.push_back(
				Uniform(uniformValueGenerator, UniformType(GL_FLOAT_VEC3, arraySizesSegmented), Loc::C(8)));
		}
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(12)));
		return doRun(uniforms);
	}